

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void array_container_union
               (array_container_t *array_1,array_container_t *array_2,array_container_t *out)

{
  int iVar1;
  size_t sVar2;
  uint16_t *in_RDX;
  array_container_t *in_RSI;
  uint16_t *in_RDI;
  int32_t max_cardinality;
  int32_t card_2;
  int32_t card_1;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  int iVar4;
  
  iVar4 = *(int *)in_RDI;
  iVar3 = in_RSI->cardinality;
  iVar1 = iVar4 + iVar3;
  if (*(int *)(in_RDX + 2) < iVar1) {
    array_container_grow(in_RSI,(int32_t)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  }
  sVar2 = fast_union_uint16(in_RDI,(size_t)in_RSI,in_RDX,CONCAT44(iVar4,iVar3),
                            (uint16_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
  *(int *)in_RDX = (int)sVar2;
  return;
}

Assistant:

void array_container_union(const array_container_t *array_1,
                           const array_container_t *array_2,
                           array_container_t *out) {
    const int32_t card_1 = array_1->cardinality, card_2 = array_2->cardinality;
    const int32_t max_cardinality = card_1 + card_2;

    if (out->capacity < max_cardinality) {
        array_container_grow(out, max_cardinality, false);
    }
    out->cardinality = (int32_t)fast_union_uint16(
        array_1->array, card_1, array_2->array, card_2, out->array);
}